

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::set<bool,std::less<bool>,std::allocator<bool>>,void>
               (set<bool,_std::less<bool>,_std::allocator<bool>_> *container,ostream *os)

{
  char8_t *pcVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  long lVar4;
  _Rb_tree_header *p_Var5;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  p_Var2 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(container->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var5) {
    lVar4 = 0;
    do {
      if ((lVar4 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar4 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_001d4331;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      uVar3 = (ulong)(byte)(char)p_Var2[1]._M_color;
      pcVar1 = "some_false";
      if (uVar3 != 0) {
        pcVar1 = "some_true";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1 + 5,uVar3 ^ 5);
      lVar4 = lVar4 + 1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var5);
    if (lVar4 != 0) {
LAB_001d4331:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }